

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O3

TimingControl *
slang::ast::Delay3Control::fromParams
          (Compilation *compilation,ParameterValueAssignmentSyntax *exprs,ASTContext *context)

{
  SyntaxKind SVar1;
  SourceLocation args;
  bool bVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  SourceLocation SVar4;
  Diagnostic *diag;
  Delay3Control *pDVar5;
  ulong uVar6;
  SourceRange *args_00;
  long lVar7;
  SourceRange SVar8;
  Expression *delays [3];
  SourceRange local_58;
  Expression *local_48;
  SourceRange local_40;
  undefined4 extraout_var;
  
  args_00 = &local_58;
  if ((exprs->parameters).elements._M_extent._M_extent_value - 7 < 0xfffffffffffffffa) {
    SVar8 = slang::syntax::SyntaxNode::sourceRange(&exprs->super_SyntaxNode);
    ASTContext::addDiag(context,(DiagCode)0x540007,SVar8);
LAB_003457db:
    args_00->startLoc = (SourceLocation)0x0;
    pDVar5 = (Delay3Control *)
             BumpAllocator::
             emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                       (&compilation->super_BumpAllocator,(TimingControl **)args_00);
  }
  else {
    local_58.startLoc = (SourceLocation)0x0;
    local_58.endLoc = (SourceLocation)0x0;
    local_48 = (Expression *)0x0;
    lVar7 = 0;
    uVar6 = 0;
    do {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((exprs->parameters).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      SVar1 = (*ppSVar3)->kind;
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((exprs->parameters).elements._M_ptr)->super_ConstTokenOrSyntax)
                                   .
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar7));
      if (SVar1 != OrderedParamAssignment) {
        SVar8 = slang::syntax::SyntaxNode::sourceRange(*ppSVar3);
        ASTContext::addDiag(context,(DiagCode)0x540007,SVar8);
LAB_003457d6:
        args_00 = &local_40;
        goto LAB_003457db;
      }
      SVar4._0_4_ = Expression::bind((int)*(undefined8 *)(*ppSVar3 + 1),(sockaddr *)context,0);
      SVar4._4_4_ = extraout_var;
      (&local_58.startLoc)[uVar6] = SVar4;
      bVar2 = Type::isNumeric(*(Type **)((long)SVar4 + 8));
      args = local_58.startLoc;
      if (!bVar2) {
        diag = ASTContext::addDiag(context,(DiagCode)0x140008,*(SourceRange *)((long)SVar4 + 0x20));
        ast::operator<<(diag,*(Type **)((long)SVar4 + 8));
        goto LAB_003457d6;
      }
      uVar6 = uVar6 + 1;
      lVar7 = lVar7 + 0x30;
    } while (uVar6 < (exprs->parameters).elements._M_extent._M_extent_value + 1 >> 1);
    local_40 = slang::syntax::SyntaxNode::sourceRange
                         (&(exprs->parameters).super_SyntaxListBase.super_SyntaxNode);
    pDVar5 = BumpAllocator::
             emplace<slang::ast::Delay3Control,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::ast::Expression_const*&,slang::SourceRange>
                       (&compilation->super_BumpAllocator,(Expression *)args,
                        (Expression **)&local_58.endLoc,&local_48,&local_40);
  }
  return &pDVar5->super_TimingControl;
}

Assistant:

TimingControl& Delay3Control::fromParams(Compilation& compilation,
                                         const ParameterValueAssignmentSyntax& exprs,
                                         const ASTContext& context) {
    auto& items = exprs.parameters;
    if (items.size() < 1 || items.size() > 3) {
        context.addDiag(diag::ExpectedNetDelay, exprs.sourceRange());
        return badCtrl(compilation, nullptr);
    }

    const Expression* delays[3] = {nullptr};
    for (size_t i = 0; i < items.size(); i++) {
        if (items[i]->kind != SyntaxKind::OrderedParamAssignment) {
            context.addDiag(diag::ExpectedNetDelay, items[i]->sourceRange());
            return badCtrl(compilation, nullptr);
        }

        delays[i] = &Expression::bind(*items[i]->as<OrderedParamAssignmentSyntax>().expr, context);

        if (!delays[i]->type->isNumeric()) {
            context.addDiag(diag::DelayNotNumeric, delays[i]->sourceRange) << *delays[i]->type;
            return badCtrl(compilation, nullptr);
        }
    }

    SLANG_ASSERT(delays[0]);
    return *compilation.emplace<Delay3Control>(*delays[0], delays[1], delays[2],
                                               items.sourceRange());
}